

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

FieldDescriptor * __thiscall
google::protobuf::DescriptorPool::FindFieldByName(DescriptorPool *this,string *name)

{
  anon_union_8_8_13f84498_for_Symbol_2 aVar1;
  Symbol SVar2;
  
  SVar2 = Tables::FindByNameHelper
                    ((this->tables_)._M_t.
                     super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                     .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>.
                     _M_head_impl,this,name);
  aVar1 = SVar2.field_1;
  if ((SVar2.type != FIELD) ||
     (*(FieldDescriptor *)(aVar1.descriptor + 0x42) == (FieldDescriptor)0x1)) {
    aVar1.descriptor = (Descriptor *)0x0;
  }
  return (FieldDescriptor *)aVar1.descriptor;
}

Assistant:

const FieldDescriptor* DescriptorPool::FindFieldByName(
    const std::string& name) const {
  Symbol result = tables_->FindByNameHelper(this, name);
  if (result.type == Symbol::FIELD &&
      !result.field_descriptor->is_extension()) {
    return result.field_descriptor;
  } else {
    return nullptr;
  }
}